

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::lts_20240722::Mutex::IncrementSynchSem(Mutex *mu,PerThreadSynch *w)

{
  ThreadIdentity *identity;
  PerThreadSynch *w_local;
  Mutex *mu_local;
  
  AbslInternalAnnotateIgnoreReadsBegin_lts_20240722();
  identity = base_internal::PerThreadSynch::thread_identity(w);
  synchronization_internal::PerThreadSem::Post(identity);
  AbslInternalAnnotateIgnoreReadsEnd_lts_20240722();
  return;
}

Assistant:

void Mutex::IncrementSynchSem(Mutex* mu, PerThreadSynch* w) {
  static_cast<void>(mu);  // Prevent unused param warning in non-TSAN builds.
  ABSL_TSAN_MUTEX_PRE_DIVERT(mu, 0);
  // We miss synchronization around passing PerThreadSynch between threads
  // since it happens inside of the Mutex code, so we need to ignore all
  // accesses to the object.
  ABSL_ANNOTATE_IGNORE_READS_AND_WRITES_BEGIN();
  PerThreadSem::Post(w->thread_identity());
  ABSL_ANNOTATE_IGNORE_READS_AND_WRITES_END();
  ABSL_TSAN_MUTEX_POST_DIVERT(mu, 0);
}